

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEdit::setTabStopDistance(QPlainTextEdit *this,qreal distance)

{
  long lVar1;
  QTextDocument *pQVar2;
  long in_FS_OFFSET;
  QTextOption opt;
  undefined1 *local_30;
  double local_28;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = -NAN;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document(*(QWidgetTextControl **)(lVar1 + 800));
  QTextDocument::defaultTextOption();
  if (0.0 <= distance) {
    if ((local_28 != distance) || (NAN(local_28) || NAN(distance))) {
      local_28 = distance;
      pQVar2 = QWidgetTextControl::document(*(QWidgetTextControl **)(lVar1 + 800));
      QTextDocument::setDefaultTextOption((QTextOption *)pQVar2);
    }
  }
  QTextOption::~QTextOption((QTextOption *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::setTabStopDistance(qreal distance)
{
    Q_D(QPlainTextEdit);
    QTextOption opt = d->control->document()->defaultTextOption();
    if (opt.tabStopDistance() == distance || distance < 0)
        return;
    opt.setTabStopDistance(distance);
    d->control->document()->setDefaultTextOption(opt);
}